

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3NestedParse(Parse *pParse,char *zFormat,...)

{
  sqlite3 *db_00;
  char in_AL;
  char *zSql_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined1 local_d8 [8];
  char saveBuf [136];
  u32 savedDbFlags;
  sqlite3 *db;
  char *zSql;
  va_list ap;
  char *zFormat_local;
  Parse *pParse_local;
  
  if (in_AL != '\0') {
    local_158 = in_XMM0_Qa;
    local_148 = in_XMM1_Qa;
    local_138 = in_XMM2_Qa;
    local_128 = in_XMM3_Qa;
    local_118 = in_XMM4_Qa;
    local_108 = in_XMM5_Qa;
    local_f8 = in_XMM6_Qa;
    local_e8 = in_XMM7_Qa;
  }
  db_00 = pParse->db;
  saveBuf._132_4_ = db_00->mDbFlags;
  if ((pParse->nErr == 0) && (pParse->eParseMode == '\0')) {
    ap[0].overflow_arg_area = local_188;
    ap[0]._0_8_ = &stack0x00000008;
    zSql._4_4_ = 0x30;
    zSql._0_4_ = 0x10;
    local_178 = in_RDX;
    local_170 = in_RCX;
    local_168 = in_R8;
    local_160 = in_R9;
    zSql_00 = sqlite3VMPrintf(db_00,zFormat,(__va_list_tag *)&zSql);
    if (zSql_00 == (char *)0x0) {
      if (db_00->mallocFailed == '\0') {
        pParse->rc = 0x12;
      }
      pParse->nErr = pParse->nErr + 1;
    }
    else {
      pParse->nested = pParse->nested + '\x01';
      memcpy(local_d8,&pParse->sLastToken,0x88);
      memset(&pParse->sLastToken,0,0x88);
      db_00->mDbFlags = db_00->mDbFlags | 2;
      sqlite3RunParser(pParse,zSql_00);
      db_00->mDbFlags = saveBuf._132_4_;
      sqlite3DbFree(db_00,zSql_00);
      memcpy(&pParse->sLastToken,local_d8,0x88);
      pParse->nested = pParse->nested + 0xff;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3NestedParse(Parse *pParse, const char *zFormat, ...){
  va_list ap;
  char *zSql;
  sqlite3 *db = pParse->db;
  u32 savedDbFlags = db->mDbFlags;
  char saveBuf[PARSE_TAIL_SZ];

  if( pParse->nErr ) return;
  if( pParse->eParseMode ) return;
  assert( pParse->nested<10 );  /* Nesting should only be of limited depth */
  va_start(ap, zFormat);
  zSql = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    /* This can result either from an OOM or because the formatted string
    ** exceeds SQLITE_LIMIT_LENGTH.  In the latter case, we need to set
    ** an error */
    if( !db->mallocFailed ) pParse->rc = SQLITE_TOOBIG;
    pParse->nErr++;
    return;
  }
  pParse->nested++;
  memcpy(saveBuf, PARSE_TAIL(pParse), PARSE_TAIL_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  db->mDbFlags |= DBFLAG_PreferBuiltin;
  sqlite3RunParser(pParse, zSql);
  db->mDbFlags = savedDbFlags;
  sqlite3DbFree(db, zSql);
  memcpy(PARSE_TAIL(pParse), saveBuf, PARSE_TAIL_SZ);
  pParse->nested--;
}